

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Prog * re2::Compiler::CompileSet(Regexp *re,Anchor anchor,int64_t max_mem)

{
  ushort uVar1;
  Regexp *re_00;
  Frag b;
  Frag FVar2;
  Prog *this;
  bool dfa_failed;
  Compiler local_c8;
  StringPiece sp;
  
  Compiler(&local_c8);
  uVar1 = re->parse_flags_;
  (local_c8.prog_)->flags_ = (uint)uVar1;
  if ((uVar1 & 0x20) != 0) {
    local_c8.encoding_ = kEncodingLatin1;
  }
  if (max_mem < 1) {
    local_c8.max_ninst_ = 100000;
  }
  else {
    local_c8.max_ninst_ = 0;
    if (0x1a0 < (ulong)max_mem) {
      local_c8.max_ninst_ = 0x1000000;
      if (max_mem - 0x1a0U < 0x8000000) {
        local_c8.max_ninst_ = (int)(max_mem - 0x1a0U >> 3);
      }
    }
  }
  local_c8.max_mem_ = max_mem;
  local_c8.anchor_ = anchor;
  re_00 = Regexp::Simplify(re);
  if (re_00 != (Regexp *)0x0) {
    local_c8.super_Walker<re2::Frag>.max_visits_ = local_c8.max_ninst_ * 2;
    b = Regexp::Walker<re2::Frag>::WalkInternal
                  (&local_c8.super_Walker<re2::Frag>,re_00,(Frag)0x0,false);
    Regexp::Decref(re_00);
    if (local_c8.failed_ == false) {
      (local_c8.prog_)->anchor_start_ = true;
      (local_c8.prog_)->anchor_end_ = true;
      if (anchor == UNANCHORED) {
        FVar2 = ByteRange(&local_c8,0,0xff,false);
        FVar2 = Star(&local_c8,FVar2,true);
        b = Cat(&local_c8,FVar2,b);
      }
      (local_c8.prog_)->start_ = b.begin;
      (local_c8.prog_)->start_unanchored_ = b.begin;
      this = Finish(&local_c8);
      if (this != (Prog *)0x0) {
        dfa_failed = false;
        sp.data_ = "hello, world";
        sp.size_ = 0xc;
        Prog::SearchDFA(this,&sp,&sp,kAnchored,kManyMatch,(StringPiece *)0x0,&dfa_failed,
                        (SparseSet *)0x0);
        if (dfa_failed != true) goto LAB_001c5840;
        Prog::~Prog(this);
        operator_delete(this);
      }
    }
  }
  this = (Prog *)0x0;
LAB_001c5840:
  ~Compiler(&local_c8);
  return this;
}

Assistant:

Prog* Compiler::CompileSet(Regexp* re, RE2::Anchor anchor, int64_t max_mem) {
  Compiler c;
  c.Setup(re->parse_flags(), max_mem, anchor);

  Regexp* sre = re->Simplify();
  if (sre == NULL)
    return NULL;

  Frag all = c.WalkExponential(sre, Frag(), 2*c.max_ninst_);
  sre->Decref();
  if (c.failed_)
    return NULL;

  c.prog_->set_anchor_start(true);
  c.prog_->set_anchor_end(true);

  if (anchor == RE2::UNANCHORED) {
    // Prepend .* or else the expression will effectively be anchored.
    // Complemented by the ANCHOR_BOTH case in PostVisit().
    all = c.Cat(c.DotStar(), all);
  }
  c.prog_->set_start(all.begin);
  c.prog_->set_start_unanchored(all.begin);

  Prog* prog = c.Finish();
  if (prog == NULL)
    return NULL;

  // Make sure DFA has enough memory to operate,
  // since we're not going to fall back to the NFA.
  bool dfa_failed = false;
  StringPiece sp = "hello, world";
  prog->SearchDFA(sp, sp, Prog::kAnchored, Prog::kManyMatch,
                  NULL, &dfa_failed, NULL);
  if (dfa_failed) {
    delete prog;
    return NULL;
  }

  return prog;
}